

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O0

void __thiscall
CMU462::PathTracer::raytrace_tile(PathTracer *this,int tile_x,int tile_y,int tile_w,int tile_h)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  reference pvVar4;
  Spectrum SVar5;
  Spectrum local_a8;
  undefined1 local_94 [8];
  Spectrum s;
  size_t x;
  size_t y;
  size_t num_samples_tile;
  size_t tile_idx_y;
  size_t tile_idx_x;
  unsigned_long local_58;
  size_t tile_end_y;
  unsigned_long local_48;
  size_t tile_end_x;
  size_t tile_start_y;
  size_t tile_start_x;
  size_t h;
  size_t w;
  int tile_h_local;
  int tile_w_local;
  int tile_y_local;
  int tile_x_local;
  PathTracer *this_local;
  
  h = (this->sampleBuffer).w;
  tile_start_x = (this->sampleBuffer).h;
  tile_start_y = (size_t)tile_x;
  tile_end_x = (size_t)tile_y;
  tile_end_y = tile_start_y + (long)tile_w;
  w._0_4_ = tile_h;
  w._4_4_ = tile_w;
  tile_h_local = tile_y;
  tile_w_local = tile_x;
  _tile_y_local = this;
  puVar1 = std::min<unsigned_long>(&tile_end_y,&h);
  local_48 = *puVar1;
  tile_idx_x = tile_end_x + (long)(int)w;
  puVar1 = std::min<unsigned_long>(&tile_idx_x,&tile_start_x);
  local_58 = *puVar1;
  uVar2 = (ulong)(long)tile_w_local / this->imageTileSize;
  uVar3 = (ulong)(long)tile_h_local / this->imageTileSize;
  std::vector<int,_std::allocator<int>_>::operator[]
            (&this->tile_samples,uVar2 + uVar3 * this->num_tiles_w);
  x = tile_end_x;
  while( true ) {
    if (local_58 <= x) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->tile_samples,uVar2 + uVar3 * this->num_tiles_w);
      *pvVar4 = *pvVar4 + 1;
      HDRImageBuffer::toColor
                (&this->sampleBuffer,&this->frameBuffer,tile_start_y,tile_end_x,local_48,local_58);
      return;
    }
    if ((this->continueRaytracing & 1U) == 0) break;
    s.g = (float)(undefined4)tile_start_y;
    s.b = (float)tile_start_y._4_4_;
    for (; (ulong)s._4_8_ < local_48; s._4_8_ = s._4_8_ + 1) {
      SVar5 = raytrace_pixel(this,s._4_8_,x);
      local_a8._0_8_ = SVar5._0_8_;
      local_94._0_4_ = local_a8.r;
      local_94._4_4_ = local_a8.g;
      local_a8.b = SVar5.b;
      s.r = local_a8.b;
      HDRImageBuffer::update_pixel(&this->sampleBuffer,(Spectrum *)local_94,s._4_8_,x);
    }
    x = x + 1;
  }
  return;
}

Assistant:

void PathTracer::raytrace_tile(int tile_x, int tile_y,
      int tile_w, int tile_h) {

    size_t w = sampleBuffer.w;
    size_t h = sampleBuffer.h;

    size_t tile_start_x = tile_x;
    size_t tile_start_y = tile_y;

    size_t tile_end_x = std::min(tile_start_x + tile_w, w);
    size_t tile_end_y = std::min(tile_start_y + tile_h, h);

    size_t tile_idx_x = tile_x / imageTileSize;
    size_t tile_idx_y = tile_y / imageTileSize;
    size_t num_samples_tile = tile_samples[tile_idx_x + tile_idx_y * num_tiles_w];

    for (size_t y = tile_start_y; y < tile_end_y; y++) {
      if (!continueRaytracing) return;
      for (size_t x = tile_start_x; x < tile_end_x; x++) {
        Spectrum s = raytrace_pixel(x, y);
        sampleBuffer.update_pixel(s, x, y);
      }
    }

    tile_samples[tile_idx_x + tile_idx_y * num_tiles_w] += 1;
    sampleBuffer.toColor(frameBuffer, tile_start_x, tile_start_y, tile_end_x, tile_end_y);
  }